

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

mp_int * ssh_rsakex_decrypt(RSAKey *rsa,ssh_hashalg *h,ptrlen ciphertext)

{
  size_t sVar1;
  uint8_t uVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  mp_int *pmVar6;
  mp_int *x;
  uint8_t *ptr;
  ulong uVar7;
  uint uVar8;
  uint8_t *puVar9;
  uint uVar10;
  bool bVar11;
  BinarySource src [1];
  uchar labelhash [64];
  BinarySource local_a8;
  undefined1 local_78 [72];
  
  sVar1 = h->hlen;
  sVar5 = mp_get_nbits(rsa->modulus);
  uVar10 = (uint)(sVar5 + 7 >> 3);
  if ((long)(int)uVar10 == ciphertext.len) {
    pmVar6 = mp_from_bytes_be(ciphertext);
    x = rsa_privkey_op(pmVar6,rsa);
    ptr = (uint8_t *)safemalloc(ciphertext.len,1,0);
    if (0 < (int)uVar10) {
      uVar7 = (ulong)(uVar10 & 0x7fffffff);
      puVar9 = ptr;
      do {
        uVar7 = uVar7 - 1;
        uVar2 = mp_get_byte(x,uVar7);
        *puVar9 = uVar2;
        puVar9 = puVar9 + 1;
      } while (uVar7 != 0);
    }
    mp_free(pmVar6);
    mp_free(x);
    uVar8 = (uint)sVar1;
    uVar7 = (ulong)(int)uVar8;
    puVar9 = ptr + uVar7 + 1;
    oaep_mask(h,puVar9,~uVar8 + uVar10,ptr + 1,uVar8);
    oaep_mask(h,ptr + 1,uVar8,puVar9,~uVar8 + uVar10);
    if (*ptr == '\0') {
      if (0x40 < uVar7) {
        __assert_fail("HLEN <= lenof(labelhash)",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/rsa.c"
                      ,0x43e,"mp_int *ssh_rsakex_decrypt(RSAKey *, const ssh_hashalg *, ptrlen)");
      }
      hash_simple(h,(ptrlen)ZEXT816(0x178eed),local_78);
      iVar3 = bcmp(puVar9,local_78,uVar7);
      if (iVar3 == 0) {
        uVar4 = uVar8 * 2 + 1;
        if ((int)uVar4 < (int)uVar10) {
          puVar9 = ptr + (int)(uVar8 * 2);
          uVar8 = uVar8 * 2 + 2;
          do {
            puVar9 = puVar9 + 1;
            if (*puVar9 != '\0') {
              uVar4 = uVar8;
              if (*puVar9 != '\x01') goto LAB_001643fe;
              break;
            }
            bVar11 = uVar8 != uVar10;
            uVar4 = uVar10;
            uVar8 = uVar8 + 1;
          } while (bVar11);
        }
        local_a8.data = ptr + (int)uVar4;
        local_a8.len = (size_t)(int)(uVar10 - uVar4);
        local_a8.binarysource_ = &local_a8;
        local_a8.pos = 0;
        local_a8.err = BSE_NO_ERROR;
        pmVar6 = BinarySource_get_mp_ssh2(local_a8.binarysource_);
        safefree(ptr);
        if (((local_a8.binarysource_)->err == BSE_NO_ERROR) &&
           ((local_a8.binarysource_)->len == (local_a8.binarysource_)->pos)) {
          return pmVar6;
        }
        mp_free(pmVar6);
        return (mp_int *)0x0;
      }
    }
LAB_001643fe:
    safefree(ptr);
  }
  return (mp_int *)0x0;
}

Assistant:

mp_int *ssh_rsakex_decrypt(
    RSAKey *rsa, const ssh_hashalg *h, ptrlen ciphertext)
{
    mp_int *b1, *b2;
    int outlen, i;
    unsigned char *out;
    unsigned char labelhash[64];
    BinarySource src[1];
    const int HLEN = h->hlen;

    /*
     * Decryption side of the RSA key exchange operation.
     */

    /* The length of the encrypted data should be exactly the length
     * in octets of the RSA modulus.. */
    outlen = (7 + mp_get_nbits(rsa->modulus)) / 8;
    if (ciphertext.len != outlen)
        return NULL;

    /* Do the RSA decryption, and extract the result into a byte array. */
    b1 = mp_from_bytes_be(ciphertext);
    b2 = rsa_privkey_op(b1, rsa);
    out = snewn(outlen, unsigned char);
    for (i = 0; i < outlen; i++)
        out[i] = mp_get_byte(b2, outlen-1-i);
    mp_free(b1);
    mp_free(b2);

    /* Do the OAEP masking operations, in the reverse order from encryption */
    oaep_mask(h, out+HLEN+1, outlen-HLEN-1, out+1, HLEN);
    oaep_mask(h, out+1, HLEN, out+HLEN+1, outlen-HLEN-1);

    /* Check the leading byte is zero. */
    if (out[0] != 0) {
        sfree(out);
        return NULL;
    }
    /* Check the label hash at position 1+HLEN */
    assert(HLEN <= lenof(labelhash));
    hash_simple(h, PTRLEN_LITERAL(""), labelhash);
    if (memcmp(out + HLEN + 1, labelhash, HLEN)) {
        sfree(out);
        return NULL;
    }
    /* Expect zero bytes followed by a 1 byte */
    for (i = 1 + 2 * HLEN; i < outlen; i++) {
        if (out[i] == 1) {
            i++;  /* skip over the 1 byte */
            break;
        } else if (out[i] != 0) {
            sfree(out);
            return NULL;
        }
    }
    /* And what's left is the input message data, which should be
     * encoded as an ordinary SSH-2 mpint. */
    BinarySource_BARE_INIT(src, out + i, outlen - i);
    b1 = get_mp_ssh2(src);
    sfree(out);
    if (get_err(src) || get_avail(src) != 0) {
        mp_free(b1);
        return NULL;
    }

    /* Success! */
    return b1;
}